

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_lower_bound_Test::TestBody(test_matrix_sparse_lower_bound_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> non_zero_00;
  bool bVar1;
  size_t *psVar2;
  char *pcVar3;
  pointer this_00;
  AssertHelper local_bf8;
  Message local_bf0;
  value_type local_be8;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_bd8;
  iterator local_bc8;
  size_t local_ba8 [2];
  const_iterator_element local_b98;
  undefined1 local_b78 [8];
  AssertionResult gtest_ar_25;
  Message local_b60;
  size_t local_b58;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_b50;
  iterator local_b40;
  size_t local_b20 [2];
  const_iterator_element local_b10;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar_24;
  Message local_ad8;
  int local_acc;
  size_t local_ac8 [2];
  const_iterator_element local_ab8;
  undefined1 local_a98 [8];
  AssertionResult gtest_ar_23;
  Message local_a80;
  int local_a74;
  size_t local_a70 [2];
  const_iterator_element local_a60;
  undefined1 local_a40 [8];
  AssertionResult gtest_ar_22;
  Message local_a28;
  int local_a1c;
  size_t local_a18 [2];
  const_iterator_element local_a08;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_21;
  Message local_9d0;
  int local_9c4;
  size_t local_9c0 [2];
  const_iterator_element local_9b0;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_20;
  Message local_978;
  int local_96c;
  size_t local_968 [2];
  const_iterator_element local_958;
  undefined1 local_938 [8];
  AssertionResult gtest_ar_19;
  Message local_920;
  int local_914;
  size_t local_910 [2];
  const_iterator_element local_900;
  undefined1 local_8e0 [8];
  AssertionResult gtest_ar_18;
  Message local_8c8;
  size_t local_8c0;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_8b8;
  iterator local_8a8;
  size_t local_888 [2];
  const_iterator_element local_878;
  undefined1 local_858 [8];
  AssertionResult gtest_ar_17;
  Message local_840;
  int local_834;
  size_t local_830 [2];
  const_iterator_element local_820;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_16;
  Message local_7e8;
  int local_7dc;
  size_t local_7d8 [2];
  const_iterator_element local_7c8;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_15;
  Message local_790;
  int local_784;
  size_t local_780 [2];
  const_iterator_element local_770;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_14;
  Message local_738;
  int local_72c;
  size_t local_728 [2];
  const_iterator_element local_718;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_13;
  unsigned_long local_6b8 [4];
  iterator local_698;
  undefined8 local_690;
  unsigned_long local_688 [5];
  iterator local_660;
  undefined8 local_658;
  undefined1 local_650 [8];
  Matrix_Sparse matrix_const;
  Message local_5f8;
  undefined1 local_5f0 [48];
  pointer local_5c0;
  pointer local_5b8;
  iterator_element local_5b0;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_12;
  Message local_578;
  undefined8 local_570;
  undefined1 local_568 [48];
  pointer local_538;
  pointer local_530;
  iterator_element local_528;
  undefined1 local_508 [8];
  AssertionResult gtest_ar_11;
  Message local_4f0;
  int local_4e4;
  size_t local_4e0 [2];
  iterator_element local_4d0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_10;
  Message local_498;
  int local_48c;
  size_t local_488 [2];
  iterator_element local_478;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_9;
  Message local_440;
  int local_434;
  size_t local_430 [2];
  iterator_element local_420;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_8;
  Message local_3e8;
  int local_3dc;
  size_t local_3d8 [2];
  iterator_element local_3c8;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_7;
  Message local_390;
  int local_384;
  size_t local_380 [2];
  iterator_element local_370;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_6;
  Message local_338;
  int local_32c;
  size_t local_328 [2];
  iterator_element local_318;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_5;
  Message local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0 [48];
  pointer local_2a0;
  pointer local_298;
  iterator_element local_290;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  Message local_258;
  int local_24c;
  size_t local_248 [2];
  iterator_element local_238;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_3;
  Message local_200;
  int local_1f4;
  size_t local_1f0 [2];
  iterator_element local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_2;
  Message local_1a8;
  int local_19c;
  size_t local_198 [2];
  iterator_element local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  Message local_150;
  int local_148 [4];
  size_t local_138 [2];
  iterator_element local_128;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  unsigned_long local_c8 [4];
  iterator local_a8;
  undefined8 local_a0;
  unsigned_long local_98 [5];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  Matrix_Sparse matrix;
  test_matrix_sparse_lower_bound_Test *this_local;
  
  local_98[2] = 3;
  local_98[3] = 3;
  local_98[0] = 0;
  local_98[1] = 1;
  local_70 = local_98;
  local_68 = 4;
  local_c8[0] = 1;
  local_c8[1] = 0;
  local_c8[2] = 2;
  local_a8 = local_c8;
  local_a0 = 3;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  non_zero_00._M_len = 4;
  non_zero_00._M_array = local_70;
  index_00._M_len = 3;
  index_00._M_array = local_a8;
  value._M_len = 3;
  value._M_array = (iterator)&gtest_ar.message_;
  matrix.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60,non_zero_00,index_00,value,3);
  local_138[1] = 0;
  local_138[0] = 0;
  Disa::Matrix_Sparse::lower_bound(&local_128,(Matrix_Sparse *)local_60,local_138 + 1,local_138);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(&local_128);
  local_148[0] = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_108,"matrix.lower_bound(0, 0).i_row()","0",psVar2,local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_198[1] = 0;
  local_198[0] = 0;
  Disa::Matrix_Sparse::lower_bound(&local_188,(Matrix_Sparse *)local_60,local_198 + 1,local_198);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(&local_188);
  local_19c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_168,"matrix.lower_bound(0, 0).i_column()","1",psVar2,&local_19c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1f0[1] = 0;
  local_1f0[0] = 1;
  Disa::Matrix_Sparse::lower_bound(&local_1e0,(Matrix_Sparse *)local_60,local_1f0 + 1,local_1f0);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(&local_1e0);
  local_1f4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1c0,"matrix.lower_bound(0, 1).i_row()","0",psVar2,&local_1f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_248[1] = 0;
  local_248[0] = 1;
  Disa::Matrix_Sparse::lower_bound(&local_238,(Matrix_Sparse *)local_60,local_248 + 1,local_248);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(&local_238);
  local_24c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_218,"matrix.lower_bound(0, 1).i_column()","1",psVar2,&local_24c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_298 = (pointer)0x0;
  local_2a0 = (pointer)0x2;
  Disa::Matrix_Sparse::lower_bound
            (&local_290,(Matrix_Sparse *)local_60,(size_t *)&local_298,(size_t *)&local_2a0);
  local_2d8 = 0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2d0,(size_t *)local_60);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)(local_2d0 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2d0);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_270,"matrix.lower_bound(0, 2)","matrix[0].end()",&local_290,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_2d0 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_328[1] = 1;
  local_328[0] = 0;
  Disa::Matrix_Sparse::lower_bound(&local_318,(Matrix_Sparse *)local_60,local_328 + 1,local_328);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(&local_318);
  local_32c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2f8,"matrix.lower_bound(1, 0).i_row()","1",psVar2,&local_32c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1eb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  local_380[1] = 1;
  local_380[0] = 0;
  Disa::Matrix_Sparse::lower_bound(&local_370,(Matrix_Sparse *)local_60,local_380 + 1,local_380);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(&local_370);
  local_384 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_350,"matrix.lower_bound(1, 0).i_column()","0",psVar2,&local_384);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  local_3d8[1] = 1;
  local_3d8[0] = 1;
  Disa::Matrix_Sparse::lower_bound(&local_3c8,(Matrix_Sparse *)local_60,local_3d8 + 1,local_3d8);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(&local_3c8);
  local_3dc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3a8,"matrix.lower_bound(1, 1).i_row()","1",psVar2,&local_3dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ed,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  local_430[1] = 1;
  local_430[0] = 1;
  Disa::Matrix_Sparse::lower_bound(&local_420,(Matrix_Sparse *)local_60,local_430 + 1,local_430);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(&local_420);
  local_434 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_400,"matrix.lower_bound(1, 1).i_column()","2",psVar2,&local_434);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ee,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  local_488[1] = 1;
  local_488[0] = 2;
  Disa::Matrix_Sparse::lower_bound(&local_478,(Matrix_Sparse *)local_60,local_488 + 1,local_488);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(&local_478);
  local_48c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_458,"matrix.lower_bound(1, 2).i_row()","1",psVar2,&local_48c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  local_4e0[1] = 1;
  local_4e0[0] = 2;
  Disa::Matrix_Sparse::lower_bound(&local_4d0,(Matrix_Sparse *)local_60,local_4e0 + 1,local_4e0);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(&local_4d0);
  local_4e4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4b0,"matrix.lower_bound(1, 2).i_column()","2",psVar2,&local_4e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_530 = (pointer)0x2;
  local_538 = (pointer)0x0;
  Disa::Matrix_Sparse::lower_bound
            (&local_528,(Matrix_Sparse *)local_60,(size_t *)&local_530,(size_t *)&local_538);
  local_570 = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_568,(size_t *)local_60);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)(local_568 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_568);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_508,"matrix.lower_bound(2, 0)","matrix[2].end()",&local_528,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_568 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  local_5b8 = (pointer)0x3;
  local_5c0 = (pointer)0x3;
  Disa::Matrix_Sparse::lower_bound
            (&local_5b0,(Matrix_Sparse *)local_60,(size_t *)&local_5b8,(size_t *)&local_5c0);
  Disa::Matrix_Sparse::end((Matrix_Sparse *)local_5f0);
  this_00 = Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::
            operator-><Disa::Matrix_Sparse,_true>
                      ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_5f0);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end((iterator *)(local_5f0 + 0x10),this_00);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_590,"matrix.lower_bound(3, 3)","matrix.end()->end()",&local_5b0,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_5f0 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&matrix_const.column_size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,499,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&matrix_const.column_size,&local_5f8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&matrix_const.column_size);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  local_688[2] = 3;
  local_688[3] = 3;
  local_688[0] = 0;
  local_688[1] = 1;
  local_660 = local_688;
  local_658 = 4;
  local_6b8[0] = 1;
  local_6b8[1] = 0;
  local_6b8[2] = 2;
  local_698 = local_6b8;
  local_690 = 3;
  gtest_ar_13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  non_zero._M_len = 4;
  non_zero._M_array = local_660;
  index._M_len = 3;
  index._M_array = local_698;
  value_00._M_len = 3;
  value_00._M_array = (iterator)&gtest_ar_13.message_;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_650,non_zero,index,value_00,3);
  local_728[1] = 0;
  local_728[0] = 0;
  Disa::Matrix_Sparse::lower_bound(&local_718,(Matrix_Sparse *)local_650,local_728 + 1,local_728);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row(&local_718);
  local_72c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_6f8,"matrix_const.lower_bound(0, 0).i_row()","0",psVar2,&local_72c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  local_780[1] = 0;
  local_780[0] = 0;
  Disa::Matrix_Sparse::lower_bound(&local_770,(Matrix_Sparse *)local_650,local_780 + 1,local_780);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column(&local_770);
  local_784 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_750,"matrix_const.lower_bound(0, 0).i_column()","1",psVar2,&local_784
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar1) {
    testing::Message::Message(&local_790);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_750);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_790);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  local_7d8[1] = 0;
  local_7d8[0] = 1;
  Disa::Matrix_Sparse::lower_bound(&local_7c8,(Matrix_Sparse *)local_650,local_7d8 + 1,local_7d8);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row(&local_7c8);
  local_7dc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_7a8,"matrix_const.lower_bound(0, 1).i_row()","0",psVar2,&local_7dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  local_830[1] = 0;
  local_830[0] = 1;
  Disa::Matrix_Sparse::lower_bound(&local_820,(Matrix_Sparse *)local_650,local_830 + 1,local_830);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column(&local_820);
  local_834 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_800,"matrix_const.lower_bound(0, 1).i_column()","1",psVar2,&local_834
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar1) {
    testing::Message::Message(&local_840);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_840);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  local_888[1] = 0;
  local_888[0] = 2;
  Disa::Matrix_Sparse::lower_bound(&local_878,(Matrix_Sparse *)local_650,local_888 + 1,local_888);
  local_8c0 = 0;
  local_8b8 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_650,&local_8c0);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_8a8,&local_8b8);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_858,"matrix_const.lower_bound(0, 2)","matrix_const[0].end()",
             &local_878,&local_8a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar1) {
    testing::Message::Message(&local_8c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_858);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_8c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_8c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  local_910[1] = 1;
  local_910[0] = 0;
  Disa::Matrix_Sparse::lower_bound(&local_900,(Matrix_Sparse *)local_650,local_910 + 1,local_910);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row(&local_900);
  local_914 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_8e0,"matrix_const.lower_bound(1, 0).i_row()","1",psVar2,&local_914);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e0);
  if (!bVar1) {
    testing::Message::Message(&local_920);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_920);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e0);
  local_968[1] = 1;
  local_968[0] = 0;
  Disa::Matrix_Sparse::lower_bound(&local_958,(Matrix_Sparse *)local_650,local_968 + 1,local_968);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column(&local_958);
  local_96c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_938,"matrix_const.lower_bound(1, 0).i_column()","0",psVar2,&local_96c
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_938);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_938);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_938);
  local_9c0[1] = 1;
  local_9c0[0] = 1;
  Disa::Matrix_Sparse::lower_bound(&local_9b0,(Matrix_Sparse *)local_650,local_9c0 + 1,local_9c0);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row(&local_9b0);
  local_9c4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_990,"matrix_const.lower_bound(1, 1).i_row()","1",psVar2,&local_9c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  local_a18[1] = 1;
  local_a18[0] = 1;
  Disa::Matrix_Sparse::lower_bound(&local_a08,(Matrix_Sparse *)local_650,local_a18 + 1,local_a18);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column(&local_a08);
  local_a1c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_9e8,"matrix_const.lower_bound(1, 1).i_column()","2",psVar2,&local_a1c
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
  if (!bVar1) {
    testing::Message::Message(&local_a28);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ff,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_a28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
  local_a70[1] = 1;
  local_a70[0] = 2;
  Disa::Matrix_Sparse::lower_bound(&local_a60,(Matrix_Sparse *)local_650,local_a70 + 1,local_a70);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row(&local_a60);
  local_a74 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_a40,"matrix_const.lower_bound(1, 2).i_row()","1",psVar2,&local_a74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
  if (!bVar1) {
    testing::Message::Message(&local_a80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x200,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_a80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_a80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
  local_ac8[1] = 1;
  local_ac8[0] = 2;
  Disa::Matrix_Sparse::lower_bound(&local_ab8,(Matrix_Sparse *)local_650,local_ac8 + 1,local_ac8);
  psVar2 = Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column(&local_ab8);
  local_acc = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_a98,"matrix_const.lower_bound(1, 2).i_column()","2",psVar2,&local_acc
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a98);
  if (!bVar1) {
    testing::Message::Message(&local_ad8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x201,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_ad8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
  local_b20[1] = 2;
  local_b20[0] = 0;
  Disa::Matrix_Sparse::lower_bound(&local_b10,(Matrix_Sparse *)local_650,local_b20 + 1,local_b20);
  local_b58 = 2;
  local_b50 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_650,&local_b58);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_b40,&local_b50);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_af0,"matrix_const.lower_bound(2, 0)","matrix_const[2].end()",
             &local_b10,&local_b40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
  if (!bVar1) {
    testing::Message::Message(&local_b60);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_af0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x203,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_b60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
  local_ba8[1] = 3;
  local_ba8[0] = 3;
  Disa::Matrix_Sparse::lower_bound(&local_b98,(Matrix_Sparse *)local_650,local_ba8 + 1,local_ba8);
  local_be8 = (value_type)Disa::Matrix_Sparse::end((Matrix_Sparse *)local_650);
  local_bd8 = Disa::Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator*
                        ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&local_be8);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_bc8,&local_bd8);
  testing::internal::EqHelper::
  Compare<Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_Disa::Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>,_nullptr>
            ((EqHelper *)local_b78,"matrix_const.lower_bound(3, 3)","(*matrix_const.end()).end()",
             &local_b98,&local_bc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b78);
  if (!bVar1) {
    testing::Message::Message(&local_bf0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b78);
    testing::internal::AssertHelper::AssertHelper
              (&local_bf8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x204,pcVar3);
    testing::internal::AssertHelper::operator=(&local_bf8,&local_bf0);
    testing::internal::AssertHelper::~AssertHelper(&local_bf8);
    testing::Message::~Message(&local_bf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b78);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_650);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, lower_bound) {
  Matrix_Sparse matrix({0, 1, 3, 3}, {1, 0, 2}, {3.0, 4.0, 5.0}, 3);
  EXPECT_EQ(matrix.lower_bound(0, 0).i_row(), 0);
  EXPECT_EQ(matrix.lower_bound(0, 0).i_column(), 1);
  EXPECT_EQ(matrix.lower_bound(0, 1).i_row(), 0);
  EXPECT_EQ(matrix.lower_bound(0, 1).i_column(), 1);
  EXPECT_EQ(matrix.lower_bound(0, 2), matrix[0].end());

  EXPECT_EQ(matrix.lower_bound(1, 0).i_row(), 1);
  EXPECT_EQ(matrix.lower_bound(1, 0).i_column(), 0);
  EXPECT_EQ(matrix.lower_bound(1, 1).i_row(), 1);
  EXPECT_EQ(matrix.lower_bound(1, 1).i_column(), 2);
  EXPECT_EQ(matrix.lower_bound(1, 2).i_row(), 1);
  EXPECT_EQ(matrix.lower_bound(1, 2).i_column(), 2);

  EXPECT_EQ(matrix.lower_bound(2, 0), matrix[2].end());
  EXPECT_EQ(matrix.lower_bound(3, 3), matrix.end()->end());

  const Matrix_Sparse matrix_const({0, 1, 3, 3}, {1, 0, 2}, {3.0, 4.0, 5.0}, 3);
  EXPECT_EQ(matrix_const.lower_bound(0, 0).i_row(), 0);
  EXPECT_EQ(matrix_const.lower_bound(0, 0).i_column(), 1);
  EXPECT_EQ(matrix_const.lower_bound(0, 1).i_row(), 0);
  EXPECT_EQ(matrix_const.lower_bound(0, 1).i_column(), 1);
  EXPECT_EQ(matrix_const.lower_bound(0, 2), matrix_const[0].end());

  EXPECT_EQ(matrix_const.lower_bound(1, 0).i_row(), 1);
  EXPECT_EQ(matrix_const.lower_bound(1, 0).i_column(), 0);
  EXPECT_EQ(matrix_const.lower_bound(1, 1).i_row(), 1);
  EXPECT_EQ(matrix_const.lower_bound(1, 1).i_column(), 2);
  EXPECT_EQ(matrix_const.lower_bound(1, 2).i_row(), 1);
  EXPECT_EQ(matrix_const.lower_bound(1, 2).i_column(), 2);

  EXPECT_EQ(matrix_const.lower_bound(2, 0), matrix_const[2].end());
  EXPECT_EQ(matrix_const.lower_bound(3, 3), (*matrix_const.end()).end());
}